

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MP1Node.cpp
# Opt level: O2

void __thiscall MP1Node::updateMembershipList(MP1Node *this,int id,short port,long heartbeat)

{
  pointer pMVar1;
  int iVar2;
  ostream *poVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  Address logAddr;
  MemberListEntry entry;
  
  poVar3 = std::operator<<((ostream *)&std::cout,"updating membership list ...");
  std::endl<char,std::char_traits<char>>(poVar3);
  pMVar1 = (this->memberNode->memberList).
           super__Vector_base<MemberListEntry,_std::allocator<MemberListEntry>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = ((long)(this->memberNode->memberList).
                 super__Vector_base<MemberListEntry,_std::allocator<MemberListEntry>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)pMVar1) / 0x18;
  uVar7 = 0;
  uVar5 = uVar4 & 0xffffffff;
  if ((int)uVar4 < 1) {
    uVar5 = uVar7;
  }
  while( true ) {
    if (uVar5 * 0x18 - uVar7 == 0) {
      iVar2 = Params::getcurrtime(this->par);
      MemberListEntry::MemberListEntry(&entry,id,port,heartbeat,(long)iVar2);
      std::vector<MemberListEntry,_std::allocator<MemberListEntry>_>::push_back
                (&this->memberNode->memberList,&entry);
      logAddr.addr[0] = (undefined1)entry.id;
      logAddr.addr[1] = entry.id._1_1_;
      logAddr.addr[2] = entry.id._2_1_;
      logAddr.addr[3] = entry.id._3_1_;
      logAddr.addr[4] = (undefined1)entry.port;
      logAddr.addr[5] = entry.port._1_1_;
      Log::logNodeAdd(this->log,&this->memberNode->addr,&logAddr);
      poVar3 = std::operator<<((ostream *)&std::cout,"...end updateMembershipList.");
      std::endl<char,std::char_traits<char>>(poVar3);
      return;
    }
    if ((*(int *)((long)&pMVar1->id + uVar7) == id) &&
       (*(short *)((long)&pMVar1->port + uVar7) == port)) break;
    uVar7 = uVar7 + 0x18;
  }
  lVar6 = MemberListEntry::getheartbeat((MemberListEntry *)((long)&pMVar1->id + uVar7));
  if (heartbeat <= lVar6) {
    return;
  }
  pMVar1 = (this->memberNode->memberList).
           super__Vector_base<MemberListEntry,_std::allocator<MemberListEntry>_>._M_impl.
           super__Vector_impl_data._M_start;
  *(long *)((long)&pMVar1->heartbeat + uVar7) = heartbeat;
  iVar2 = Params::getcurrtime(this->par);
  MemberListEntry::settimestamp((MemberListEntry *)((long)&pMVar1->id + uVar7),(long)iVar2);
  return;
}

Assistant:

void MP1Node::updateMembershipList(int id, short port, long heartbeat) {
    cout << "updating membership list ..." << endl;

    int sizeOfMemberList = this->memberNode->memberList.size();
    for (int i = 0; i < sizeOfMemberList; i++) {
        if (memberNode->memberList[i].id == id && memberNode->memberList[i].port == port) {
            if (heartbeat > memberNode->memberList[i].getheartbeat()) {
                memberNode->memberList[i].heartbeat = heartbeat;
                memberNode->memberList[i].settimestamp(par->getcurrtime());
            }
            return;
        }
    }

    //if the memberlist does not contain the entry, create a new one and push it into the list
    MemberListEntry entry(id, port, heartbeat, par->getcurrtime());
    memberNode->memberList.push_back(entry);

#ifdef DEBUGLOG
    Address logAddr;
    memcpy(&logAddr.addr[0], &entry.id, sizeof(int));
    memcpy(&logAddr.addr[4], &entry.port, sizeof(short));
    log->logNodeAdd(&memberNode->addr, &logAddr);
#endif

    cout << "...end updateMembershipList." << endl;
}